

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_intersects(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  bitset_t *pbVar4;
  bitset_t *pbVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint64_t uVar9;
  long lVar10;
  ulong uVar11;
  int i;
  undefined8 unaff_R12;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong unaff_R15;
  ulong auStack_a8 [5];
  bitset_t *pbStack_80;
  bitset_t *pbStack_78;
  code *pcStack_70;
  bitset_t *pbStack_60;
  undefined8 uStack_58;
  bitset_t *pbStack_50;
  code *pcStack_48;
  bitset_t *pbStack_38;
  bitset_t *pbStack_30;
  
  pbStack_30 = (bitset_t *)0x10222e;
  pbVar3 = bitset_create();
  pbStack_30 = (bitset_t *)0x102236;
  pbVar4 = bitset_create();
  pbStack_30 = (bitset_t *)0x102241;
  _Var2 = bitset_empty(pbVar3);
  if (_Var2) {
    uVar12 = 0;
    do {
      uVar13 = uVar12 >> 6;
      if ((uVar12 & 1) == 0) {
        unaff_R15 = 0x3e;
        pbVar5 = pbVar3;
        if (uVar13 < pbVar3->arraysize) goto LAB_0010229f;
        pbStack_30 = (bitset_t *)0x102287;
        _Var2 = bitset_grow(pbVar3,uVar13 + 1);
LAB_0010229b:
        if (_Var2 != false) goto LAB_0010229f;
      }
      else {
        unaff_R15 = 0x3f;
        pbVar5 = pbVar4;
        if (pbVar4->arraysize <= uVar13) {
          pbStack_30 = (bitset_t *)0x102298;
          _Var2 = bitset_grow(pbVar4,uVar13 + 1);
          goto LAB_0010229b;
        }
LAB_0010229f:
        uVar14 = (uint)unaff_R15 & (uint)uVar12;
        unaff_R15 = (ulong)uVar14;
        pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << (sbyte)uVar14;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000);
    pbStack_30 = (bitset_t *)0x1022cb;
    _Var2 = bitsets_intersect(pbVar3,pbVar4);
    unaff_R12 = 1000;
    if (_Var2) goto LAB_00102344;
    unaff_R15 = 0x20000000000;
    if (pbVar3->arraysize < 0x10) {
      pbStack_30 = (bitset_t *)0x1022ed;
      _Var2 = bitset_grow(pbVar3,0x10);
      if (_Var2) goto LAB_001022f1;
    }
    else {
LAB_001022f1:
      pbVar3->array[0xf] = pbVar3->array[0xf] | 0x20000000000;
    }
    if (pbVar4->arraysize < 0x10) {
      pbStack_30 = (bitset_t *)0x10230c;
      _Var2 = bitset_grow(pbVar4,0x10);
      if (_Var2) goto LAB_00102310;
    }
    else {
LAB_00102310:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    pbStack_30 = (bitset_t *)0x102322;
    _Var2 = bitsets_intersect(pbVar3,pbVar4);
    if (_Var2) {
      pbStack_30 = (bitset_t *)0x10232e;
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    pbStack_30 = (bitset_t *)0x102344;
    test_intersects_cold_1();
LAB_00102344:
    pbStack_30 = (bitset_t *)0x102349;
    test_intersects_cold_3();
  }
  pbStack_30 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_48 = (code *)0x10235c;
  pbStack_38 = pbVar3;
  pbStack_30 = pbVar4;
  pbVar3 = bitset_create_with_capacity(10);
  pcStack_48 = (code *)0x102369;
  pbVar4 = bitset_create_with_capacity(5);
  if (pbVar3->arraysize == 0) {
    pcStack_48 = (code *)0x102380;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_00102384;
  }
  else {
LAB_00102384:
    *pbVar3->array = *pbVar3->array | 2;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_48 = (code *)0x10239f;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023a3;
  }
  else {
LAB_001023a3:
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_48 = (code *)0x1023be;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023c2;
  }
  else {
LAB_001023c2:
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_48 = (code *)0x1023dd;
    _Var2 = bitset_grow(pbVar4,1);
    if (_Var2) goto LAB_001023e1;
  }
  else {
LAB_001023e1:
    *pbVar4->array = *pbVar4->array | 2;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_48 = (code *)0x1023fc;
    _Var2 = bitset_grow(pbVar4,1);
    if (_Var2) goto LAB_00102400;
  }
  else {
LAB_00102400:
    *pbVar4->array = *pbVar4->array | 0x10;
  }
  pcStack_48 = (code *)0x102412;
  _Var2 = bitset_contains_all(pbVar3,pbVar4);
  if (_Var2) {
    pcStack_48 = (code *)0x102421;
    _Var2 = bitset_contains_all(pbVar4,pbVar3);
    if (!_Var2) {
      pcStack_48 = (code *)0x10242d;
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    pcStack_48 = (code *)0x102441;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_48 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_70 = (code *)0x102453;
  pbStack_60 = pbVar3;
  uStack_58 = unaff_R12;
  pbStack_50 = pbVar4;
  pcStack_48 = (code *)unaff_R15;
  pbVar3 = bitset_create();
  uVar12 = 0;
  pcStack_70 = (code *)0x10245e;
  pbVar4 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if (uVar13 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3f);
    }
    else {
      pcStack_70 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar12 & 1) == 0) {
      if (pbVar4->arraysize <= uVar13) {
        pcStack_70 = (code *)0x1024aa;
        _Var2 = bitset_grow(pbVar4,uVar13 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      pbVar4->array[uVar13] = pbVar4->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
LAB_001024c3:
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_70 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,pbVar4);
  if (_Var2) {
    pcStack_70 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(pbVar4,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (pbVar4->arraysize < 0x10) {
      pcStack_70 = (code *)0x102501;
      _Var2 = bitset_grow(pbVar4,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    pcStack_70 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,pbVar4);
    if (!_Var2) {
      pcStack_70 = (code *)0x102530;
      _Var2 = bitset_contains_all(pbVar4,pbVar3);
      if (!_Var2) {
        pcStack_70 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(pbVar4);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_70 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_70 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_70 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_70 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar13 = 0;
  pbStack_80 = pbVar3;
  pbStack_78 = pbVar4;
  pcStack_70 = (code *)uVar12;
  pbVar3 = bitset_create();
  do {
    uVar12 = uVar13 >> 6;
    if (uVar12 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar12] = pbVar3->array[uVar12] | 1L << ((byte)uVar13 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar12 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar13 = uVar12 >> 6;
    if (uVar13 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar3->arraysize;
  if (uVar12 != 0) {
    puVar1 = pbVar3->array;
    uVar11 = 0;
    uVar13 = 0;
    lVar8 = 0;
    do {
      uVar9 = (puVar1[uVar11] >> ((byte)uVar13 & 0x3f)) << ((byte)uVar13 & 0x3f);
      uVar13 = uVar13 & 0xffffffffffffffc0;
      uVar6 = 0;
      do {
        while (uVar9 == 0) {
          uVar11 = uVar11 + 1;
          if (uVar11 == uVar12) {
            lVar10 = lVar8;
            if (uVar6 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar13 = uVar13 + 0x40;
          uVar9 = puVar1[uVar11];
          if (2 < uVar6) goto LAB_0010265a;
        }
        uVar7 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        auStack_a8[uVar6 + 1] = uVar7 | uVar13;
        uVar6 = uVar6 + 1;
        uVar9 = uVar9 & uVar9 - 1;
      } while (uVar6 != 3);
      uVar6 = 3;
LAB_0010265a:
      lVar10 = lVar8 + uVar6;
      uVar13 = lVar8 * 2 + 800;
      uVar11 = 0;
      do {
        uVar7 = lVar8 + uVar11;
        if (99 < lVar8 + uVar11) {
          uVar7 = uVar13;
        }
        if (auStack_a8[uVar11 + 1] != uVar7) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar11 = uVar11 + 1;
        uVar13 = uVar13 + 2;
      } while (uVar6 != uVar11);
      uVar13 = auStack_a8[uVar6] + 1;
      uVar11 = uVar13 >> 6;
      lVar8 = lVar10;
    } while (uVar11 < uVar12);
LAB_001026ac:
    if (lVar10 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar12 = 0;
  pbVar3 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if ((uVar13 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar13 + 1), _Var2)) {
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3f);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar13 = uVar12 >> 6;
    if ((uVar13 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar13 + 1), _Var2)) {
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar3->arraysize;
  if (uVar12 != 0) {
    uVar6 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      uVar7 = pbVar3->array[uVar6] >> ((byte)uVar13 & 0x3f);
      if (uVar7 == 0) {
        lVar8 = uVar6 * -0x40;
        do {
          uVar6 = uVar6 + 1;
          if (uVar12 == uVar6) goto LAB_001027db;
          uVar13 = pbVar3->array[uVar6];
          lVar8 = lVar8 + -0x40;
        } while (uVar13 == 0);
        lVar10 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar13 = lVar10 - lVar8;
      }
      else {
        lVar8 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar13 = uVar13 + lVar8;
      }
      uVar6 = uVar11 * 2 + 800;
      if (uVar11 < 100) {
        uVar6 = uVar11;
      }
      if (uVar13 != uVar6) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar11 = uVar11 + 1;
      uVar13 = uVar13 + 1;
      uVar6 = uVar13 >> 6;
    } while (uVar6 < uVar12);
LAB_001027db:
    if (uVar11 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_intersects() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();
  TEST_ASSERT(bitset_empty(evens));

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(!bitsets_intersect(evens, odds));

  bitset_set(evens, 1001);
  bitset_set(odds, 1001);

  TEST_ASSERT(bitsets_intersect(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}